

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVA.cpp
# Opt level: O0

int MT32Emu::calcBasicAmp
              (Tables *tables,Partial *partial,System *system,PartialParam *partialParam,
              Bit8u partVolume,RhythmTemp *rhythmTemp,int biasAmpSubtraction,int veloAmpSubtraction,
              Bit8u expression,bool hasRingModQuirk)

{
  bool bVar1;
  int local_48;
  int amp;
  bool hasRingModQuirk_local;
  RhythmTemp *rhythmTemp_local;
  Bit8u partVolume_local;
  PartialParam *partialParam_local;
  System *system_local;
  Partial *partial_local;
  Tables *tables_local;
  
  local_48 = 0x9b;
  if (hasRingModQuirk) {
    bVar1 = Partial::isRingModulatingNoMix(partial);
  }
  else {
    bVar1 = Partial::isRingModulatingSlave(partial);
  }
  if (!bVar1) {
    local_48 = 0x9b - (uint)tables->masterVolToAmpSubtraction[system->masterVol];
    if (local_48 < 0) {
      return 0;
    }
    local_48 = local_48 - (uint)tables->levelToAmpSubtraction[partVolume];
    if (local_48 < 0) {
      return 0;
    }
    local_48 = local_48 - (uint)tables->levelToAmpSubtraction[expression];
    if (local_48 < 0) {
      return 0;
    }
    if ((rhythmTemp != (RhythmTemp *)0x0) &&
       (local_48 = local_48 - (uint)tables->levelToAmpSubtraction[rhythmTemp->outputLevel],
       local_48 < 0)) {
      return 0;
    }
  }
  if (local_48 - biasAmpSubtraction < 0) {
    tables_local._4_4_ = 0;
  }
  else {
    local_48 = (local_48 - biasAmpSubtraction) -
               (uint)tables->levelToAmpSubtraction[(partialParam->tva).level];
    if (local_48 < 0) {
      tables_local._4_4_ = 0;
    }
    else {
      local_48 = local_48 - veloAmpSubtraction;
      if (local_48 < 0) {
        tables_local._4_4_ = 0;
      }
      else {
        if (0x9b < local_48) {
          local_48 = 0x9b;
        }
        tables_local._4_4_ = local_48 - ((int)(uint)(partialParam->tvf).resonance >> 1);
        if (tables_local._4_4_ < 0) {
          tables_local._4_4_ = 0;
        }
      }
    }
  }
  return tables_local._4_4_;
}

Assistant:

static int calcBasicAmp(const Tables *tables, const Partial *partial, const MemParams::System *system, const TimbreParam::PartialParam *partialParam, Bit8u partVolume, const MemParams::RhythmTemp *rhythmTemp, int biasAmpSubtraction, int veloAmpSubtraction, Bit8u expression, bool hasRingModQuirk) {
	int amp = 155;

	if (!(hasRingModQuirk ? partial->isRingModulatingNoMix() : partial->isRingModulatingSlave())) {
		amp -= tables->masterVolToAmpSubtraction[system->masterVol];
		if (amp < 0) {
			return 0;
		}
		amp -= tables->levelToAmpSubtraction[partVolume];
		if (amp < 0) {
			return 0;
		}
		amp -= tables->levelToAmpSubtraction[expression];
		if (amp < 0) {
			return 0;
		}
		if (rhythmTemp != NULL) {
			amp -= tables->levelToAmpSubtraction[rhythmTemp->outputLevel];
			if (amp < 0) {
				return 0;
			}
		}
	}
	amp -= biasAmpSubtraction;
	if (amp < 0) {
		return 0;
	}
	amp -= tables->levelToAmpSubtraction[partialParam->tva.level];
	if (amp < 0) {
		return 0;
	}
	amp -= veloAmpSubtraction;
	if (amp < 0) {
		return 0;
	}
	if (amp > 155) {
		amp = 155;
	}
	amp -= partialParam->tvf.resonance >> 1;
	if (amp < 0) {
		return 0;
	}
	return amp;
}